

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.cpp
# Opt level: O0

int __thiscall FName::NameManager::AddName(NameManager *this,char *text,uint hash,uint bucket)

{
  long lVar1;
  size_t sVar2;
  size_t len_00;
  NameEntry *pNVar3;
  int iVar4;
  size_t len;
  NameBlock *block;
  char *textstore;
  uint bucket_local;
  uint hash_local;
  char *text_local;
  NameManager *this_local;
  
  len = (size_t)this->Blocks;
  sVar2 = strlen(text);
  len_00 = sVar2 + 1;
  if (((NameBlock *)len == (NameBlock *)0x0) || (0xfff < ((NameBlock *)len)->NextAlloc + len_00)) {
    len = (size_t)AddBlock(this,len_00);
  }
  lVar1 = *(long *)len;
  strcpy((char *)(len + lVar1),text);
  *(size_t *)len = len_00 + *(long *)len;
  if (this->MaxNames <= this->NumNames) {
    iVar4 = 0x100;
    if (this->MaxNames == 0) {
      iVar4 = 0x34b;
    }
    this->MaxNames = this->MaxNames + iVar4;
    pNVar3 = (NameEntry *)
             M_Realloc_Dbg(this->NameArray,(long)this->MaxNames << 4,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/name.cpp"
                           ,0xdf);
    this->NameArray = pNVar3;
  }
  this->NameArray[this->NumNames].Text = (char *)(len + lVar1);
  this->NameArray[this->NumNames].Hash = hash;
  this->NameArray[this->NumNames].NextHash = this->Buckets[bucket];
  this->Buckets[bucket] = this->NumNames;
  iVar4 = this->NumNames;
  this->NumNames = iVar4 + 1;
  return iVar4;
}

Assistant:

int FName::NameManager::AddName (const char *text, unsigned int hash, unsigned int bucket)
{
	char *textstore;
	NameBlock *block = Blocks;
	size_t len = strlen (text) + 1;

	// Get a block large enough for the name. Only the first block in the
	// list is ever considered for name storage.
	if (block == NULL || block->NextAlloc + len >= BLOCK_SIZE)
	{
		block = AddBlock (len);
	}

	// Copy the string into the block.
	textstore = (char *)block + block->NextAlloc;
	strcpy (textstore, text);
	block->NextAlloc += len;

	// Add an entry for the name to the NameArray
	if (NumNames >= MaxNames)
	{
		// If no names have been defined yet, make the first allocation
		// large enough to hold all the predefined names.
		MaxNames += MaxNames == 0 ? countof(PredefinedNames) + NAME_GROW_AMOUNT : NAME_GROW_AMOUNT;

		NameArray = (NameEntry *)M_Realloc (NameArray, MaxNames * sizeof(NameEntry));
	}

	NameArray[NumNames].Text = textstore;
	NameArray[NumNames].Hash = hash;
	NameArray[NumNames].NextHash = Buckets[bucket];
	Buckets[bucket] = NumNames;

	return NumNames++;
}